

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void VP8IteratorImport(VP8EncIterator *it,uint8_t *tmp_32)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int src_stride;
  int len;
  int len_00;
  int len_01;
  long lVar4;
  long lVar5;
  uint8_t *src;
  uint8_t *in_RSI;
  int *in_RDI;
  int uv_h;
  int uv_w;
  int h;
  int w;
  uint8_t *vsrc;
  uint8_t *usrc;
  uint8_t *ysrc;
  WebPPicture *pic;
  int y;
  int x;
  VP8Encoder *enc;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  lVar3 = *(long *)(*(long *)(in_RDI + 10) + 8);
  lVar4 = *(long *)(lVar3 + 0x10) + (long)((iVar2 * *(int *)(lVar3 + 0x28) + iVar1) * 0x10);
  lVar5 = *(long *)(lVar3 + 0x18) + (long)((iVar2 * *(int *)(lVar3 + 0x2c) + iVar1) * 8);
  src = (uint8_t *)(*(long *)(lVar3 + 0x20) + (long)((iVar2 * *(int *)(lVar3 + 0x2c) + iVar1) * 8));
  src_stride = MinSize(*(int *)(lVar3 + 8) + iVar1 * -0x10,0x10);
  len = MinSize(*(int *)(lVar3 + 0xc) + iVar2 * -0x10,0x10);
  len_00 = src_stride + 1 >> 1;
  len_01 = len + 1 >> 1;
  ImportBlock(src,src_stride,(uint8_t *)CONCAT44(len_00,len_01),in_stack_ffffffffffffffac,
              in_stack_ffffffffffffffa8,0);
  ImportBlock(src,src_stride,(uint8_t *)CONCAT44(len_00,len_01),in_stack_ffffffffffffffac,
              in_stack_ffffffffffffffa8,0);
  ImportBlock(src,src_stride,(uint8_t *)CONCAT44(len_00,len_01),in_stack_ffffffffffffffac,
              in_stack_ffffffffffffffa8,0);
  if (in_RSI != (uint8_t *)0x0) {
    if (iVar1 == 0) {
      InitLeft((VP8EncIterator *)0x1a56b5);
    }
    else {
      if (iVar2 == 0) {
        *(undefined1 *)(*(long *)(in_RDI + 0x5e) + -1) = 0x7f;
        *(undefined1 *)(*(long *)(in_RDI + 0x5c) + -1) = 0x7f;
        *(undefined1 *)(*(long *)(in_RDI + 0x5a) + -1) = 0x7f;
      }
      else {
        *(undefined1 *)(*(long *)(in_RDI + 0x5a) + -1) =
             *(undefined1 *)(lVar4 + (-1 - *(int *)(lVar3 + 0x28)));
        *(undefined1 *)(*(long *)(in_RDI + 0x5c) + -1) =
             *(undefined1 *)(lVar5 + (-1 - *(int *)(lVar3 + 0x2c)));
        *(uint8_t *)(*(long *)(in_RDI + 0x5e) + -1) = src[-1 - *(int *)(lVar3 + 0x2c)];
      }
      ImportLine((uint8_t *)(lVar4 + -1),*(int *)(lVar3 + 0x28),*(uint8_t **)(in_RDI + 0x5a),len,
                 0x10);
      ImportLine((uint8_t *)(lVar5 + -1),*(int *)(lVar3 + 0x2c),*(uint8_t **)(in_RDI + 0x5c),len_01,
                 8);
      ImportLine(src + -1,*(int *)(lVar3 + 0x2c),*(uint8_t **)(in_RDI + 0x5e),len_01,8);
    }
    *(uint8_t **)(in_RDI + 0x60) = in_RSI;
    *(uint8_t **)(in_RDI + 0x62) = in_RSI + 0x10;
    if (iVar2 == 0) {
      memset(in_RSI,0x7f,0x20);
    }
    else {
      ImportLine((uint8_t *)(lVar4 - *(int *)(lVar3 + 0x28)),1,in_RSI,src_stride,0x10);
      ImportLine((uint8_t *)(lVar5 - *(int *)(lVar3 + 0x2c)),1,in_RSI + 0x10,len_00,8);
      ImportLine(src + -(long)*(int *)(lVar3 + 0x2c),1,in_RSI + 0x18,len_00,8);
    }
  }
  return;
}

Assistant:

void VP8IteratorImport(VP8EncIterator* const it, uint8_t* const tmp_32) {
  const VP8Encoder* const enc = it->enc;
  const int x = it->x, y = it->y;
  const WebPPicture* const pic = enc->pic;
  const uint8_t* const ysrc = pic->y + (y * pic->y_stride  + x) * 16;
  const uint8_t* const usrc = pic->u + (y * pic->uv_stride + x) * 8;
  const uint8_t* const vsrc = pic->v + (y * pic->uv_stride + x) * 8;
  const int w = MinSize(pic->width - x * 16, 16);
  const int h = MinSize(pic->height - y * 16, 16);
  const int uv_w = (w + 1) >> 1;
  const int uv_h = (h + 1) >> 1;

  ImportBlock(ysrc, pic->y_stride,  it->yuv_in + Y_OFF_ENC, w, h, 16);
  ImportBlock(usrc, pic->uv_stride, it->yuv_in + U_OFF_ENC, uv_w, uv_h, 8);
  ImportBlock(vsrc, pic->uv_stride, it->yuv_in + V_OFF_ENC, uv_w, uv_h, 8);

  if (tmp_32 == NULL) return;

  // Import source (uncompressed) samples into boundary.
  if (x == 0) {
    InitLeft(it);
  } else {
    if (y == 0) {
      it->y_left[-1] = it->u_left[-1] = it->v_left[-1] = 127;
    } else {
      it->y_left[-1] = ysrc[- 1 - pic->y_stride];
      it->u_left[-1] = usrc[- 1 - pic->uv_stride];
      it->v_left[-1] = vsrc[- 1 - pic->uv_stride];
    }
    ImportLine(ysrc - 1, pic->y_stride,  it->y_left, h,   16);
    ImportLine(usrc - 1, pic->uv_stride, it->u_left, uv_h, 8);
    ImportLine(vsrc - 1, pic->uv_stride, it->v_left, uv_h, 8);
  }

  it->y_top  = tmp_32 + 0;
  it->uv_top = tmp_32 + 16;
  if (y == 0) {
    memset(tmp_32, 127, 32 * sizeof(*tmp_32));
  } else {
    ImportLine(ysrc - pic->y_stride,  1, tmp_32,          w,   16);
    ImportLine(usrc - pic->uv_stride, 1, tmp_32 + 16,     uv_w, 8);
    ImportLine(vsrc - pic->uv_stride, 1, tmp_32 + 16 + 8, uv_w, 8);
  }
}